

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_disk_posix.c
# Opt level: O0

char * archive_read_disk_uname(archive *_a,int64_t uid)

{
  int iVar1;
  undefined8 in_RSI;
  long in_RDI;
  archive_read_disk *a;
  char *in_stack_00000078;
  uint in_stack_00000080;
  uint in_stack_00000084;
  archive *in_stack_00000088;
  undefined8 local_8;
  
  iVar1 = __archive_check_magic
                    (in_stack_00000088,in_stack_00000084,in_stack_00000080,in_stack_00000078);
  if (iVar1 == 0) {
    if (*(long *)(in_RDI + 0xc0) == 0) {
      local_8 = (char *)0x0;
    }
    else {
      local_8 = (char *)(**(code **)(in_RDI + 0xc0))(*(undefined8 *)(in_RDI + 0xd0),in_RSI);
    }
  }
  else {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *
archive_read_disk_uname(struct archive *_a, int64_t uid)
{
	struct archive_read_disk *a = (struct archive_read_disk *)_a;
	if (ARCHIVE_OK != __archive_check_magic(_a, ARCHIVE_READ_DISK_MAGIC,
		ARCHIVE_STATE_ANY, "archive_read_disk_uname"))
		return (NULL);
	if (a->lookup_uname == NULL)
		return (NULL);
	return ((*a->lookup_uname)(a->lookup_uname_data, uid));
}